

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlglvideo.cpp
# Opt level: O0

bool __thiscall SDLGLFB::CanUpdate(SDLGLFB *this)

{
  SDLGLFB *this_local;
  
  if (this->m_Lock == 1) {
    this_local._7_1_ = true;
  }
  else {
    if (0 < this->m_Lock) {
      this->UpdatePending = true;
      this->m_Lock = this->m_Lock + -1;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SDLGLFB::CanUpdate ()
{
	if (m_Lock != 1)
	{
		if (m_Lock > 0)
		{
			UpdatePending = true;
			--m_Lock;
		}
		return false;
	}
	return true;
}